

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O3

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  kmp_int32 gtid;
  int iVar1;
  unsigned_long_long *puVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  long lVar6;
  unsigned_long_long *puVar7;
  ulong uVar8;
  undefined1 *puVar9;
  void *in_RCX;
  int in_EDX;
  kmp_uint32 kVar10;
  unsigned_long_long uVar11;
  int iVar12;
  int tasks_completed;
  int local_44;
  void *local_40;
  ulong local_38;
  
  kVar10 = __kmp_yield_init;
  puVar2 = (this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc;
  local_44 = 0;
  puVar7 = (this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.loc;
  uVar11 = (this->super_kmp_basic_flag<unsigned_long_long>).checker;
  if (*puVar7 == uVar11) {
    puVar9 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
      _Var5 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
      return _Var5;
    }
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    local_40 = in_RCX;
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar6 = __kmp_hardware_timestamp();
      local_38 = lVar6 + *(long *)((long)__stat_loc + 0x88);
      puVar7 = (this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.
               loc;
      uVar11 = (this->super_kmp_basic_flag<unsigned_long_long>).checker;
    }
    iVar4 = __kmp_nth;
    iVar3 = __kmp_avail_proc;
    iVar12 = 0;
    if (*puVar7 != uVar11) {
      iVar12 = 0;
      do {
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_001403c0:
          lVar6 = 0;
        }
        else {
          lVar6 = *(long *)((long)__stat_loc + 0x170);
          if (lVar6 == 0) {
            *(undefined4 *)((long)__stat_loc + 0x198) = 1;
            goto LAB_001403c0;
          }
          if (*(int *)(lVar6 + 0xc0) == 0) {
            *(undefined8 *)((long)__stat_loc + 0x170) = 0;
LAB_001403d1:
            *(undefined4 *)((long)__stat_loc + 0x198) = 1;
          }
          else {
            if (*(int *)(lVar6 + 0x50) != 1) goto LAB_001403d1;
            __kmp_execute_tasks_64((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&local_44,local_40,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar12 < __kmp_itt_prepare_delay)) &&
           (iVar12 = iVar12 + 1, __kmp_itt_prepare_delay <= iVar12)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar2);
        }
        if (__kmp_global.g.g_done != 0) {
LAB_001404fc:
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
          break;
        }
        if (iVar3 < iVar4) {
          __kmp_yield(1);
        }
        else {
          kVar10 = kVar10 - 2;
          if (kVar10 == 0) {
            __kmp_yield(1);
            kVar10 = __kmp_yield_next;
          }
        }
        iVar1 = *(int *)((long)__stat_loc + 0x60);
        if ((*(char *)((long)__stat_loc + 0x19c) == '\0') == (iVar1 != 0)) {
          if (iVar1 == 0) {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
            UNLOCK();
          }
          else {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
            UNLOCK();
          }
          *(bool *)((long)__stat_loc + 0x19c) = iVar1 != 0;
        }
        if (((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar6 == 0 || (*(int *)(lVar6 + 0x50) == 0)))
            ) && (uVar8 = __kmp_hardware_timestamp(), local_38 <= uVar8)) {
          __kmp_suspend_64(gtid,this);
          if (__kmp_global.g.g_done != 0) goto LAB_001404fc;
          if ((__kmp_tasking_mode != tskm_immediate_exec) &&
             (*(int *)((long)__stat_loc + 0x198) == 1)) {
            *(undefined4 *)((long)__stat_loc + 0x198) = 0;
          }
        }
      } while (*(this->super_kmp_basic_flag<unsigned_long_long>).super_kmp_flag<unsigned_long_long>.
                loc != (this->super_kmp_basic_flag<unsigned_long_long>).checker);
    }
    puVar9 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar12)
    {
      puVar9 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
    }
  }
  return (__pid_t)puVar9;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    __kmp_wait_template(this_thr, this,
                        final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }